

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined4 local_28;
  float fStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  pIVar1 = GImGui;
  if ((window->Flags & 0x2000000) == 0) {
    IVar10 = (GImGui->Style).DisplaySafeAreaPadding;
    fVar8 = IVar10.x;
    fVar9 = IVar10.y;
    IVar10 = (GImGui->IO).DisplaySize;
    fVar8 = IVar10.x - (fVar8 + fVar8);
    fVar9 = IVar10.y - (fVar9 + fVar9);
    IVar10 = (GImGui->Style).WindowMinSize;
    fVar14 = IVar10.x;
    fVar15 = IVar10.y;
    uVar2 = -(uint)(fVar8 <= fVar14);
    uVar3 = -(uint)(fVar9 <= fVar15);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         CONCAT44(~uVar3 & (uint)fVar9,~uVar2 & (uint)fVar8) |
         CONCAT44((uint)fVar15 & uVar3,(uint)fVar14 & uVar2);
    IVar10 = *size_contents;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = IVar10.x;
    auVar5._4_4_ = IVar10.y;
    auVar12 = minps(auVar11,auVar5);
    uVar2 = -(uint)(IVar10.x < fVar14);
    uVar3 = -(uint)(IVar10.y < fVar15);
    auVar6._0_4_ = ~uVar2 & auVar12._0_4_;
    auVar6._4_4_ = ~uVar3 & auVar12._4_4_;
    auVar6._8_4_ = auVar12._8_4_;
    auVar6._12_4_ = auVar12._12_4_;
    auVar12._4_4_ = (uint)fVar15 & uVar3;
    auVar12._0_4_ = (uint)fVar14 & uVar2;
    auVar12._8_8_ = 0;
    auVar7 = auVar6 | auVar12;
    IVar4 = CalcSizeAfterConstraint(window,auVar7._0_8_);
    if ((IVar4.x < size_contents->x) && ((window->Flags & 0x808U) == 0x800)) {
      local_28 = auVar7._0_4_;
      fStack_24 = auVar7._4_4_;
      uStack_20 = auVar7._8_4_;
      uStack_1c = auVar7._12_4_;
      auVar7._4_4_ = fStack_24 + (pIVar1->Style).ScrollbarSize;
      auVar7._0_4_ = local_28;
      auVar7._8_4_ = uStack_20;
      auVar7._12_4_ = uStack_1c;
    }
    IVar10 = auVar7._0_8_;
    if ((IVar4.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      auVar13._4_12_ = auVar7._4_12_;
      auVar13._0_4_ = auVar7._0_4_ + (pIVar1->Style).ScrollbarSize;
      IVar10 = auVar13._0_8_;
    }
  }
  else {
    IVar10 = *size_contents;
  }
  return IVar10;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        ImVec2 size_auto_fit = ImClamp(size_contents, style.WindowMinSize, ImMax(style.WindowMinSize, g.IO.DisplaySize - g.Style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}